

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_16_tos_pd(void)

{
  uint uVar1;
  uint value;
  uint addr_in;
  
  uVar1 = m68ki_cpu.s_flag;
  if (m68ki_cpu.s_flag != 0) {
    addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 2;
    m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in;
    my_fc_handler(uVar1 | m68ki_address_space);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    value = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
    m68ki_set_sr(value);
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_move_16_tos_pd(void)
{
	if(FLAG_S)
	{
		uint new_sr = OPER_AY_PD_16();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_set_sr(new_sr);
		return;
	}
	m68ki_exception_privilege_violation();
}